

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGetPropertyCommand.cxx
# Opt level: O0

bool cmGetPropertyCommand
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,cmExecutionStatus *status)

{
  cmExecutionStatus *pcVar1;
  bool bVar2;
  size_type sVar3;
  const_reference pvVar4;
  const_reference pvVar5;
  ulong uVar6;
  cmMakefile *pcVar7;
  cmState *pcVar8;
  cmPropertyDefinition *pcVar9;
  string *psVar10;
  reference ppcVar11;
  string_view sVar12;
  byte local_349;
  bool source_file_paths_should_be_absolute;
  cmMakefile *directory_scope_mf;
  string_view local_230;
  string_view local_220;
  cmPropertyDefinition *local_210;
  cmPropertyDefinition *def_1;
  string output_1;
  cmPropertyDefinition *def;
  string output;
  cmMakefile *pcStack_1a8;
  bool test_scopes_handled;
  cmMakefile *test_directory_makefile;
  undefined1 local_198 [7];
  bool source_file_scopes_handled;
  vector<cmMakefile_*,_std::allocator<cmMakefile_*>_> source_file_directory_makefiles;
  string local_178;
  string local_158;
  uint local_134;
  int local_130;
  uint i;
  Doing doing;
  ScopeType local_108;
  byte local_101;
  ScopeType scope;
  bool test_directory_option_enabled;
  string test_directory;
  undefined1 local_d8 [6];
  bool source_file_target_option_enabled;
  bool source_file_directory_option_enabled;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  source_file_target_directories;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  source_file_directories;
  string propertyName;
  string name;
  string *variable;
  allocator<char> local_49;
  string local_48;
  OutType local_24;
  cmExecutionStatus *pcStack_20;
  OutType infoType;
  cmExecutionStatus *status_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  
  local_24 = OutValue;
  pcStack_20 = status;
  status_local = (cmExecutionStatus *)args;
  sVar3 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(args);
  pcVar1 = pcStack_20;
  if (sVar3 < 3) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_48,"called with incorrect number of arguments",&local_49);
    cmExecutionStatus::SetError(pcVar1,&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    std::allocator<char>::~allocator(&local_49);
    args_local._7_1_ = 0;
    goto LAB_004ba48a;
  }
  pvVar4 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)status_local,0);
  std::__cxx11::string::string((string *)(propertyName.field_2._M_local_buf + 8));
  std::__cxx11::string::string
            ((string *)
             &source_file_directories.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&source_file_target_directories.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_d8);
  test_directory.field_2._M_local_buf[0xf] = '\0';
  test_directory.field_2._M_local_buf[0xe] = '\0';
  std::__cxx11::string::string((string *)&scope);
  local_101 = 0;
  pvVar5 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)status_local,1);
  bVar2 = std::operator==(pvVar5,"GLOBAL");
  if (bVar2) {
    local_108 = GLOBAL;
LAB_004b9796:
    local_130 = 1;
    for (local_134 = 2; uVar6 = (ulong)local_134,
        sVar3 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)status_local), uVar6 < sVar3; local_134 = local_134 + 1) {
      pvVar5 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)status_local,(ulong)local_134);
      bVar2 = std::operator==(pvVar5,"PROPERTY");
      if (bVar2) {
        local_130 = 2;
      }
      else {
        pvVar5 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)status_local,(ulong)local_134);
        bVar2 = std::operator==(pvVar5,"BRIEF_DOCS");
        if (bVar2) {
          local_130 = 0;
          local_24 = OutBriefDoc;
        }
        else {
          pvVar5 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)status_local,(ulong)local_134);
          bVar2 = std::operator==(pvVar5,"FULL_DOCS");
          if (bVar2) {
            local_130 = 0;
            local_24 = OutFullDoc;
          }
          else {
            pvVar5 = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   *)status_local,(ulong)local_134);
            bVar2 = std::operator==(pvVar5,"SET");
            if (bVar2) {
              local_130 = 0;
              local_24 = OutSet;
            }
            else {
              pvVar5 = std::
                       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     *)status_local,(ulong)local_134);
              bVar2 = std::operator==(pvVar5,"DEFINED");
              if (bVar2) {
                local_130 = 0;
                local_24 = OutDefined;
              }
              else if (local_130 == 1) {
                local_130 = 0;
                pvVar5 = std::
                         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       *)status_local,(ulong)local_134);
                std::__cxx11::string::operator=
                          ((string *)(propertyName.field_2._M_local_buf + 8),(string *)pvVar5);
              }
              else {
                if ((local_130 == 0) && (local_108 == SOURCE_FILE)) {
                  pvVar5 = std::
                           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         *)status_local,(ulong)local_134);
                  bVar2 = std::operator==(pvVar5,"DIRECTORY");
                  if (bVar2) {
                    local_130 = 4;
                    test_directory.field_2._M_local_buf[0xf] = '\x01';
                    goto LAB_004b9c15;
                  }
                }
                if ((local_130 == 0) && (local_108 == SOURCE_FILE)) {
                  pvVar5 = std::
                           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         *)status_local,(ulong)local_134);
                  bVar2 = std::operator==(pvVar5,"TARGET_DIRECTORY");
                  if (bVar2) {
                    local_130 = 5;
                    test_directory.field_2._M_local_buf[0xe] = '\x01';
                    goto LAB_004b9c15;
                  }
                }
                if ((local_130 == 0) && (local_108 == TEST)) {
                  pvVar5 = std::
                           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         *)status_local,(ulong)local_134);
                  bVar2 = std::operator==(pvVar5,"DIRECTORY");
                  if (bVar2) {
                    local_130 = 6;
                    local_101 = 1;
                    goto LAB_004b9c15;
                  }
                }
                pcVar1 = pcStack_20;
                if (local_130 == 4) {
                  pvVar5 = std::
                           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         *)status_local,(ulong)local_134);
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)&source_file_target_directories.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage,pvVar5);
                  local_130 = 0;
                }
                else if (local_130 == 5) {
                  pvVar5 = std::
                           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         *)status_local,(ulong)local_134);
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)local_d8,pvVar5);
                  local_130 = 0;
                }
                else if (local_130 == 6) {
                  pvVar5 = std::
                           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         *)status_local,(ulong)local_134);
                  std::__cxx11::string::operator=((string *)&scope,(string *)pvVar5);
                  local_130 = 0;
                }
                else {
                  if (local_130 != 2) {
                    pvVar4 = std::
                             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           *)status_local,(ulong)local_134);
                    cmStrCat<char_const(&)[25],std::__cxx11::string_const&,char_const(&)[3]>
                              (&local_158,(char (*) [25])"given invalid argument \"",pvVar4,
                               (char (*) [3])0x104275a);
                    cmExecutionStatus::SetError(pcVar1,&local_158);
                    std::__cxx11::string::~string((string *)&local_158);
                    args_local._7_1_ = 0;
                    i = 1;
                    goto LAB_004ba414;
                  }
                  local_130 = 0;
                  pvVar5 = std::
                           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         *)status_local,(ulong)local_134);
                  std::__cxx11::string::operator=
                            ((string *)
                             &source_file_directories.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage,(string *)pvVar5);
                }
              }
            }
          }
        }
      }
LAB_004b9c15:
    }
    uVar6 = std::__cxx11::string::empty();
    pcVar1 = pcStack_20;
    if ((uVar6 & 1) == 0) {
      std::vector<cmMakefile_*,_std::allocator<cmMakefile_*>_>::vector
                ((vector<cmMakefile_*,_std::allocator<cmMakefile_*>_> *)local_198);
      test_directory_makefile._7_1_ =
           SetPropertyCommand::HandleAndValidateSourceFileDirectoryScopes
                     (pcStack_20,(bool)(test_directory.field_2._M_local_buf[0xf] & 1),
                      (bool)(test_directory.field_2._M_local_buf[0xe] & 1),
                      (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&source_file_target_directories.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage,
                      (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_d8,(vector<cmMakefile_*,_std::allocator<cmMakefile_*>_> *)local_198);
      output.field_2._M_local_buf[0xf] =
           SetPropertyCommand::HandleAndValidateTestDirectoryScopes
                     (pcStack_20,(bool)(local_101 & 1),(string *)&scope,&stack0xfffffffffffffe58);
      if (((test_directory_makefile._7_1_ & 1) == 0) || (!(bool)output.field_2._M_local_buf[0xf])) {
        args_local._7_1_ = false;
        goto LAB_004ba3f8;
      }
      if (local_24 == OutBriefDoc) {
        std::__cxx11::string::string((string *)&def);
        pcVar7 = cmExecutionStatus::GetMakefile(pcStack_20);
        pcVar8 = cmMakefile::GetState(pcVar7);
        pcVar9 = cmState::GetPropertyDefinition
                           (pcVar8,(string *)
                                   &source_file_directories.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage,local_108);
        if (pcVar9 != (cmPropertyDefinition *)0x0) {
          psVar10 = cmPropertyDefinition::GetShortDescription_abi_cxx11_(pcVar9);
          std::__cxx11::string::operator=((string *)&def,(string *)psVar10);
        }
        uVar6 = std::__cxx11::string::empty();
        if ((uVar6 & 1) != 0) {
          std::__cxx11::string::operator=((string *)&def,"NOTFOUND");
        }
        pcVar7 = cmExecutionStatus::GetMakefile(pcStack_20);
        sVar12 = (string_view)
                 std::__cxx11::string::operator_cast_to_basic_string_view((string *)&def);
        output_1.field_2._8_8_ = sVar12._M_len;
        cmMakefile::AddDefinition(pcVar7,pvVar4,sVar12);
        std::__cxx11::string::~string((string *)&def);
        goto switchD_004ba1e1_default;
      }
      if (local_24 == OutFullDoc) {
        std::__cxx11::string::string((string *)&def_1);
        pcVar7 = cmExecutionStatus::GetMakefile(pcStack_20);
        pcVar8 = cmMakefile::GetState(pcVar7);
        local_210 = cmState::GetPropertyDefinition
                              (pcVar8,(string *)
                                      &source_file_directories.
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage,local_108)
        ;
        if (local_210 != (cmPropertyDefinition *)0x0) {
          psVar10 = cmPropertyDefinition::GetFullDescription_abi_cxx11_(local_210);
          std::__cxx11::string::operator=((string *)&def_1,(string *)psVar10);
        }
        uVar6 = std::__cxx11::string::empty();
        if ((uVar6 & 1) != 0) {
          std::__cxx11::string::operator=((string *)&def_1,"NOTFOUND");
        }
        pcVar7 = cmExecutionStatus::GetMakefile(pcStack_20);
        local_220 = (string_view)
                    std::__cxx11::string::operator_cast_to_basic_string_view((string *)&def_1);
        cmMakefile::AddDefinition(pcVar7,pvVar4,local_220);
        std::__cxx11::string::~string((string *)&def_1);
        goto switchD_004ba1e1_default;
      }
      if (local_24 == OutDefined) {
        pcVar7 = cmExecutionStatus::GetMakefile(pcStack_20);
        pcVar8 = cmMakefile::GetState(pcVar7);
        pcVar9 = cmState::GetPropertyDefinition
                           (pcVar8,(string *)
                                   &source_file_directories.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage,local_108);
        if (pcVar9 == (cmPropertyDefinition *)0x0) {
          pcVar7 = cmExecutionStatus::GetMakefile(pcStack_20);
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    ((basic_string_view<char,_std::char_traits<char>_> *)&directory_scope_mf,"0");
          cmMakefile::AddDefinition(pcVar7,pvVar4,_directory_scope_mf);
        }
        else {
          pcVar7 = cmExecutionStatus::GetMakefile(pcStack_20);
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_230,"1");
          cmMakefile::AddDefinition(pcVar7,pvVar4,local_230);
        }
        goto switchD_004ba1e1_default;
      }
      ppcVar11 = std::vector<cmMakefile_*,_std::allocator<cmMakefile_*>_>::operator[]
                           ((vector<cmMakefile_*,_std::allocator<cmMakefile_*>_> *)local_198,0);
      sVar12._M_str = local_220._M_str;
      sVar12._M_len = local_220._M_len;
      local_349 = 1;
      if ((test_directory.field_2._M_local_buf[0xf] & 1U) == 0) {
        local_349 = test_directory.field_2._M_local_buf[0xe];
      }
      switch(local_108) {
      case TARGET:
        args_local._7_1_ =
             anon_unknown.dwarf_6f6e32::HandleTargetMode
                       (pcStack_20,(string *)((long)&propertyName.field_2 + 8),local_24,pvVar4,
                        (string *)
                        &source_file_directories.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
        break;
      case SOURCE_FILE:
        args_local._7_1_ =
             anon_unknown.dwarf_6f6e32::HandleSourceMode
                       (pcStack_20,(string *)((long)&propertyName.field_2 + 8),local_24,pvVar4,
                        (string *)
                        &source_file_directories.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage,*ppcVar11,
                        (bool)(local_349 & 1));
        break;
      case DIRECTORY:
        args_local._7_1_ =
             anon_unknown.dwarf_6f6e32::HandleDirectoryMode
                       (pcStack_20,(string *)((long)&propertyName.field_2 + 8),local_24,pvVar4,
                        (string *)
                        &source_file_directories.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
        break;
      case GLOBAL:
        args_local._7_1_ =
             anon_unknown.dwarf_6f6e32::HandleGlobalMode
                       (pcStack_20,(string *)((long)&propertyName.field_2 + 8),local_24,pvVar4,
                        (string *)
                        &source_file_directories.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
        break;
      case CACHE:
        args_local._7_1_ =
             anon_unknown.dwarf_6f6e32::HandleCacheMode
                       (pcStack_20,(string *)((long)&propertyName.field_2 + 8),local_24,pvVar4,
                        (string *)
                        &source_file_directories.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
        break;
      case TEST:
        args_local._7_1_ =
             anon_unknown.dwarf_6f6e32::HandleTestMode
                       (pcStack_20,(string *)((long)&propertyName.field_2 + 8),local_24,pvVar4,
                        (string *)
                        &source_file_directories.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage,pcStack_1a8);
        break;
      case VARIABLE:
        args_local._7_1_ =
             anon_unknown.dwarf_6f6e32::HandleVariableMode
                       (pcStack_20,(string *)((long)&propertyName.field_2 + 8),local_24,pvVar4,
                        (string *)
                        &source_file_directories.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
        break;
      case CACHED_VARIABLE:
        local_220 = sVar12;
      default:
switchD_004ba1e1_default:
        args_local._7_1_ = true;
        break;
      case INSTALL:
        args_local._7_1_ =
             anon_unknown.dwarf_6f6e32::HandleInstallMode
                       (pcStack_20,(string *)((long)&propertyName.field_2 + 8),local_24,pvVar4,
                        (string *)
                        &source_file_directories.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
      }
LAB_004ba3f8:
      i = 1;
      std::vector<cmMakefile_*,_std::allocator<cmMakefile_*>_>::~vector
                ((vector<cmMakefile_*,_std::allocator<cmMakefile_*>_> *)local_198);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_178,"not given a PROPERTY <name> argument.",
                 (allocator<char> *)
                 ((long)&source_file_directory_makefiles.
                         super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage + 7));
      cmExecutionStatus::SetError(pcVar1,&local_178);
      std::__cxx11::string::~string((string *)&local_178);
      std::allocator<char>::~allocator
                ((allocator<char> *)
                 ((long)&source_file_directory_makefiles.
                         super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage + 7));
      args_local._7_1_ = 0;
      i = 1;
    }
  }
  else {
    pvVar5 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)status_local,1);
    bVar2 = std::operator==(pvVar5,"DIRECTORY");
    if (bVar2) {
      local_108 = DIRECTORY;
      goto LAB_004b9796;
    }
    pvVar5 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)status_local,1);
    bVar2 = std::operator==(pvVar5,"TARGET");
    if (bVar2) {
      local_108 = TARGET;
      goto LAB_004b9796;
    }
    pvVar5 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)status_local,1);
    bVar2 = std::operator==(pvVar5,"SOURCE");
    if (bVar2) {
      local_108 = SOURCE_FILE;
      goto LAB_004b9796;
    }
    pvVar5 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)status_local,1);
    bVar2 = std::operator==(pvVar5,"TEST");
    if (bVar2) {
      local_108 = TEST;
      goto LAB_004b9796;
    }
    pvVar5 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)status_local,1);
    bVar2 = std::operator==(pvVar5,"VARIABLE");
    if (bVar2) {
      local_108 = VARIABLE;
      goto LAB_004b9796;
    }
    pvVar5 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)status_local,1);
    bVar2 = std::operator==(pvVar5,"CACHE");
    if (bVar2) {
      local_108 = CACHE;
      goto LAB_004b9796;
    }
    pvVar5 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)status_local,1);
    bVar2 = std::operator==(pvVar5,"INSTALL");
    pcVar1 = pcStack_20;
    if (bVar2) {
      local_108 = INSTALL;
      goto LAB_004b9796;
    }
    pvVar4 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)status_local,1);
    cmStrCat<char_const(&)[21],std::__cxx11::string_const&,char_const(&)[87]>
              ((string *)&doing,(char (*) [21])"given invalid scope ",pvVar4,
               (char (*) [87])
               ".  Valid scopes are GLOBAL, DIRECTORY, TARGET, SOURCE, TEST, VARIABLE, CACHE, INSTALL."
              );
    cmExecutionStatus::SetError(pcVar1,(string *)&doing);
    std::__cxx11::string::~string((string *)&doing);
    args_local._7_1_ = 0;
    i = 1;
  }
LAB_004ba414:
  std::__cxx11::string::~string((string *)&scope);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_d8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&source_file_target_directories.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::__cxx11::string::~string
            ((string *)
             &source_file_directories.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::__cxx11::string::~string((string *)(propertyName.field_2._M_local_buf + 8));
LAB_004ba48a:
  return (bool)(args_local._7_1_ & 1);
}

Assistant:

bool cmGetPropertyCommand(std::vector<std::string> const& args,
                          cmExecutionStatus& status)
{
  OutType infoType = OutValue;
  if (args.size() < 3) {
    status.SetError("called with incorrect number of arguments");
    return false;
  }

  // The cmake variable in which to store the result.
  std::string const& variable = args[0];

  std::string name;
  std::string propertyName;

  std::vector<std::string> source_file_directories;
  std::vector<std::string> source_file_target_directories;
  bool source_file_directory_option_enabled = false;
  bool source_file_target_option_enabled = false;

  std::string test_directory;
  bool test_directory_option_enabled = false;

  // Get the scope from which to get the property.
  cmProperty::ScopeType scope;
  if (args[1] == "GLOBAL") {
    scope = cmProperty::GLOBAL;
  } else if (args[1] == "DIRECTORY") {
    scope = cmProperty::DIRECTORY;
  } else if (args[1] == "TARGET") {
    scope = cmProperty::TARGET;
  } else if (args[1] == "SOURCE") {
    scope = cmProperty::SOURCE_FILE;
  } else if (args[1] == "TEST") {
    scope = cmProperty::TEST;
  } else if (args[1] == "VARIABLE") {
    scope = cmProperty::VARIABLE;
  } else if (args[1] == "CACHE") {
    scope = cmProperty::CACHE;
  } else if (args[1] == "INSTALL") {
    scope = cmProperty::INSTALL;
  } else {
    status.SetError(cmStrCat(
      "given invalid scope ", args[1],
      ".  "
      "Valid scopes are "
      "GLOBAL, DIRECTORY, TARGET, SOURCE, TEST, VARIABLE, CACHE, INSTALL."));
    return false;
  }

  // Parse remaining arguments.
  enum Doing
  {
    DoingNone,
    DoingName,
    DoingProperty,
    DoingType,
    DoingSourceDirectory,
    DoingSourceTargetDirectory,
    DoingTestDirectory,
  };
  Doing doing = DoingName;
  for (unsigned int i = 2; i < args.size(); ++i) {
    if (args[i] == "PROPERTY") {
      doing = DoingProperty;
    } else if (args[i] == "BRIEF_DOCS") {
      doing = DoingNone;
      infoType = OutBriefDoc;
    } else if (args[i] == "FULL_DOCS") {
      doing = DoingNone;
      infoType = OutFullDoc;
    } else if (args[i] == "SET") {
      doing = DoingNone;
      infoType = OutSet;
    } else if (args[i] == "DEFINED") {
      doing = DoingNone;
      infoType = OutDefined;
    } else if (doing == DoingName) {
      doing = DoingNone;
      name = args[i];
    } else if (doing == DoingNone && scope == cmProperty::SOURCE_FILE &&
               args[i] == "DIRECTORY") {
      doing = DoingSourceDirectory;
      source_file_directory_option_enabled = true;
    } else if (doing == DoingNone && scope == cmProperty::SOURCE_FILE &&
               args[i] == "TARGET_DIRECTORY") {
      doing = DoingSourceTargetDirectory;
      source_file_target_option_enabled = true;
    } else if (doing == DoingNone && scope == cmProperty::TEST &&
               args[i] == "DIRECTORY") {
      doing = DoingTestDirectory;
      test_directory_option_enabled = true;
    } else if (doing == DoingSourceDirectory) {
      source_file_directories.push_back(args[i]);
      doing = DoingNone;
    } else if (doing == DoingSourceTargetDirectory) {
      source_file_target_directories.push_back(args[i]);
      doing = DoingNone;
    } else if (doing == DoingTestDirectory) {
      test_directory = args[i];
      doing = DoingNone;
    } else if (doing == DoingProperty) {
      doing = DoingNone;
      propertyName = args[i];
    } else {
      status.SetError(cmStrCat("given invalid argument \"", args[i], "\"."));
      return false;
    }
  }

  // Make sure a property name was found.
  if (propertyName.empty()) {
    status.SetError("not given a PROPERTY <name> argument.");
    return false;
  }

  std::vector<cmMakefile*> source_file_directory_makefiles;
  bool source_file_scopes_handled =
    SetPropertyCommand::HandleAndValidateSourceFileDirectoryScopes(
      status, source_file_directory_option_enabled,
      source_file_target_option_enabled, source_file_directories,
      source_file_target_directories, source_file_directory_makefiles);
  cmMakefile* test_directory_makefile;
  bool test_scopes_handled =
    SetPropertyCommand::HandleAndValidateTestDirectoryScopes(
      status, test_directory_option_enabled, test_directory,
      test_directory_makefile);
  if (!(source_file_scopes_handled && test_scopes_handled)) {
    return false;
  }

  // Compute requested output.
  if (infoType == OutBriefDoc) {
    // Lookup brief documentation.
    std::string output;
    if (cmPropertyDefinition const* def =
          status.GetMakefile().GetState()->GetPropertyDefinition(propertyName,
                                                                 scope)) {
      output = def->GetShortDescription();
    }
    if (output.empty()) {
      output = "NOTFOUND";
    }
    status.GetMakefile().AddDefinition(variable, output);
  } else if (infoType == OutFullDoc) {
    // Lookup full documentation.
    std::string output;
    if (cmPropertyDefinition const* def =
          status.GetMakefile().GetState()->GetPropertyDefinition(propertyName,
                                                                 scope)) {
      output = def->GetFullDescription();
    }
    if (output.empty()) {
      output = "NOTFOUND";
    }
    status.GetMakefile().AddDefinition(variable, output);
  } else if (infoType == OutDefined) {
    // Lookup if the property is defined
    if (status.GetMakefile().GetState()->GetPropertyDefinition(propertyName,
                                                               scope)) {
      status.GetMakefile().AddDefinition(variable, "1");
    } else {
      status.GetMakefile().AddDefinition(variable, "0");
    }
  } else {
    // Dispatch property getting.
    cmMakefile& directory_scope_mf = *(source_file_directory_makefiles[0]);
    bool source_file_paths_should_be_absolute =
      source_file_directory_option_enabled ||
      source_file_target_option_enabled;

    switch (scope) {
      case cmProperty::GLOBAL:
        return HandleGlobalMode(status, name, infoType, variable,
                                propertyName);
      case cmProperty::DIRECTORY:
        return HandleDirectoryMode(status, name, infoType, variable,
                                   propertyName);
      case cmProperty::TARGET:
        return HandleTargetMode(status, name, infoType, variable,
                                propertyName);
      case cmProperty::SOURCE_FILE:
        return HandleSourceMode(status, name, infoType, variable, propertyName,
                                directory_scope_mf,
                                source_file_paths_should_be_absolute);
      case cmProperty::TEST:
        return HandleTestMode(status, name, infoType, variable, propertyName,
                              *test_directory_makefile);
      case cmProperty::VARIABLE:
        return HandleVariableMode(status, name, infoType, variable,
                                  propertyName);
      case cmProperty::CACHE:
        return HandleCacheMode(status, name, infoType, variable, propertyName);
      case cmProperty::INSTALL:
        return HandleInstallMode(status, name, infoType, variable,
                                 propertyName);

      case cmProperty::CACHED_VARIABLE:
        break; // should never happen
    }
  }

  return true;
}